

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompel.cpp
# Opt level: O3

void __thiscall TPZCompEl::TPZCompEl(TPZCompEl *this,void **vtt,TPZCompMesh *mesh,TPZCompEl *copy)

{
  void *pvVar1;
  long nelem;
  int iVar2;
  TPZCompEl **ppTVar3;
  undefined4 extraout_var;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x60)) = vtt[1];
  this->fIntegrationRule = (TPZIntPoints *)0x0;
  this->fMesh = mesh;
  nelem = copy->fIndex;
  if (-1 < nelem) {
    ppTVar3 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (&(mesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
    *ppTVar3 = this;
  }
  this->fIndex = nelem;
  this->fReferenceIndex = copy->fReferenceIndex;
  if (copy->fIntegrationRule != (TPZIntPoints *)0x0) {
    iVar2 = (*copy->fIntegrationRule->_vptr_TPZIntPoints[9])();
    this->fIntegrationRule = (TPZIntPoints *)CONCAT44(extraout_var,iVar2);
  }
  return;
}

Assistant:

TPZCompEl::TPZCompEl(TPZCompMesh &mesh, const TPZCompEl &copy): fIntegrationRule(0) {
    fMesh = &mesh;
    int64_t index = copy.fIndex;
    if(index >= 0) mesh.ElementVec()[index] = this;
    fIndex = index;
    fReferenceIndex = copy.fReferenceIndex;
    if (copy.fIntegrationRule) {
        fIntegrationRule = copy.fIntegrationRule->Clone();
    }
}